

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_writer.c
# Opt level: O0

int rfc5444_writer_register_msgcontentprovider
              (rfc5444_writer *writer,rfc5444_writer_content_provider *cpr,
              rfc5444_writer_tlvtype *addrtlvs,size_t addrtlvs_count)

{
  rfc5444_writer_message *msg_00;
  ulong local_40;
  size_t i;
  rfc5444_writer_message *msg;
  size_t addrtlvs_count_local;
  rfc5444_writer_tlvtype *addrtlvs_local;
  rfc5444_writer_content_provider *cpr_local;
  rfc5444_writer *writer_local;
  
  if (writer->_state == RFC5444_WRITER_NONE) {
    msg_00 = _get_message(writer,cpr->msg_type);
    if (msg_00 == (rfc5444_writer_message *)0x0) {
      writer_local._4_4_ = -1;
    }
    else {
      for (local_40 = 0; local_40 < addrtlvs_count; local_40 = local_40 + 1) {
        _register_addrtlvtype(writer,msg_00,addrtlvs + local_40);
      }
      cpr->creator = msg_00;
      (cpr->_provider_node).key = cpr;
      avl_insert(&msg_00->_provider_tree,&cpr->_provider_node);
      writer_local._4_4_ = 0;
    }
    return writer_local._4_4_;
  }
  __assert_fail("writer->_state == RFC5444_WRITER_NONE",
                "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_writer.c"
                ,0x156,
                "int rfc5444_writer_register_msgcontentprovider(struct rfc5444_writer *, struct rfc5444_writer_content_provider *, struct rfc5444_writer_tlvtype *, size_t)"
               );
}

Assistant:

int
rfc5444_writer_register_msgcontentprovider(struct rfc5444_writer *writer, struct rfc5444_writer_content_provider *cpr,
  struct rfc5444_writer_tlvtype *addrtlvs, size_t addrtlvs_count) {
  struct rfc5444_writer_message *msg;
  size_t i;

#if WRITER_STATE_MACHINE == true
  assert(writer->_state == RFC5444_WRITER_NONE);
#endif
  /* first allocate the message if necessary */
  if ((msg = _get_message(writer, cpr->msg_type)) == NULL) {
    return -1;
  }

  for (i = 0; i < addrtlvs_count; i++) {
    _register_addrtlvtype(writer, msg, &addrtlvs[i]);
  }

  cpr->creator = msg;
  cpr->_provider_node.key = &cpr->priority;

  avl_insert(&msg->_provider_tree, &cpr->_provider_node);
  return 0;
}